

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::FillCacheManagerFromUI(cmCursesMainForm *this)

{
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *this_00;
  cmCursesCacheEntryComposite *pcVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  reference ppcVar5;
  cmState *pcVar6;
  char *__s;
  undefined4 extraout_var;
  string *key;
  allocator<char> local_109;
  string local_108;
  CacheEntryType local_e4;
  undefined1 local_e0 [4];
  CacheEntryType t;
  string fixedNewValue;
  string fixedOldValue;
  undefined1 local_98 [8];
  string newValue;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string oldValue;
  char *existingValue;
  string *cacheKey;
  cmCursesCacheEntryComposite *entry;
  iterator __end1;
  iterator __begin1;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *__range1;
  cmCursesMainForm *this_local;
  
  this_00 = this->Entries;
  __end1 = std::
           vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
           begin(this_00);
  entry = (cmCursesCacheEntryComposite *)
          std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
          ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                *)&entry);
    if (!bVar2) break;
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
              ::operator*(&__end1);
    pcVar1 = *ppcVar5;
    key = &pcVar1->Key;
    pcVar6 = cmake::GetState(this->CMakeInstance);
    __s = cmState::GetCacheEntryValue(pcVar6,key);
    oldValue.field_2._8_8_ = __s;
    if (__s != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_61);
      std::allocator<char>::~allocator(&local_61);
      iVar4 = (*pcVar1->Entry->_vptr_cmCursesWidget[5])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(char *)CONCAT44(extraout_var,iVar4),
                 (allocator<char> *)(fixedOldValue.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(fixedOldValue.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)(fixedNewValue.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_e0);
      pcVar6 = cmake::GetState(this->CMakeInstance);
      local_e4 = cmState::GetCacheEntryType(pcVar6,key);
      FixValue(this,local_e4,(string *)local_60,(string *)((long)&fixedNewValue.field_2 + 8));
      FixValue(this,local_e4,(string *)local_98,(string *)local_e0);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&fixedNewValue.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e0);
      if (!_Var3) {
        pcVar6 = cmake::GetState(this->CMakeInstance);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"MODIFIED",&local_109);
        cmState::SetCacheEntryBoolProperty(pcVar6,key,&local_108,true);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        pcVar6 = cmake::GetState(this->CMakeInstance);
        cmState::SetCacheEntryValue(pcVar6,key,(string *)local_e0);
      }
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)(fixedNewValue.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_60);
    }
    __gnu_cxx::
    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmCursesMainForm::FillCacheManagerFromUI()
{
  for (cmCursesCacheEntryComposite* entry : *this->Entries) {
    const std::string& cacheKey = entry->Key;
    const char* existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(cacheKey);
    if (existingValue) {
      std::string oldValue = existingValue;
      std::string newValue = entry->Entry->GetValue();
      std::string fixedOldValue;
      std::string fixedNewValue;
      cmStateEnums::CacheEntryType t =
        this->CMakeInstance->GetState()->GetCacheEntryType(cacheKey);
      this->FixValue(t, oldValue, fixedOldValue);
      this->FixValue(t, newValue, fixedNewValue);

      if (!(fixedOldValue == fixedNewValue)) {
        // The user has changed the value.  Mark it as modified.
        this->CMakeInstance->GetState()->SetCacheEntryBoolProperty(
          cacheKey, "MODIFIED", true);
        this->CMakeInstance->GetState()->SetCacheEntryValue(cacheKey,
                                                            fixedNewValue);
      }
    }
  }
}